

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<int,QString>::emplace<QString_const&>
          (iterator *__return_storage_ptr__,void *this,int *key,QString *args)

{
  Data<QHashPrivate::MultiNode<int,_QString>_> *pDVar1;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *this;
  if (pDVar1 == (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = *(char16_t **)((long)this + 8);
LAB_004175bc:
    pDVar1 = (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0;
LAB_004175e7:
    pDVar1 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_QString>_>::detached(pDVar1);
    *(Data<QHashPrivate::MultiNode<int,_QString>_> **)this = pDVar1;
LAB_004175ef:
    emplace_helper<QString_const&>(__return_storage_ptr__,this,key,args);
    QMultiHash<int,_QString>::~QMultiHash((QMultiHash<int,_QString> *)&local_40);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_40.d.ptr = *(char16_t **)((long)this + 8);
      local_40.d.d = (Data *)pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *this;
        if (pDVar1 == (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0) goto LAB_004175bc;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_004175e7;
      goto LAB_004175ef;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        emplace_helper<QString_const&>(__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_004176d0;
    }
    local_40.d.d = (args->d).d;
    local_40.d.ptr = (args->d).ptr;
    local_40.d.size = (args->d).size;
    if ((Data<QHashPrivate::MultiNode<int,_QString>_> *)local_40.d.d !=
        (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0) {
      LOCK();
      (((QArrayData *)&((Data<QHashPrivate::MultiNode<int,_QString>_> *)local_40.d.d)->ref)->ref_).
      _q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&((Data<QHashPrivate::MultiNode<int,_QString>_> *)local_40.d.d)->ref)->
           ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QMultiHash<int,_QString>::emplace_helper<QString>
              (__return_storage_ptr__,(QMultiHash<int,_QString> *)this,key,&local_40);
    if ((Data<QHashPrivate::MultiNode<int,_QString>_> *)local_40.d.d !=
        (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0) {
      LOCK();
      (((RefCount *)&(local_40.d.d)->super_QArrayData)->atomic)._q_value.super___atomic_base<int>.
      _M_i = (((RefCount *)&(local_40.d.d)->super_QArrayData)->atomic)._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((RefCount *)&(local_40.d.d)->super_QArrayData)->atomic)._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_004176d0:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }